

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_alloc.c
# Opt level: O0

void * alloc_sys(mstate m,size_t nb)

{
  char *oldbase_00;
  mchunkptr pmVar1;
  void *pvVar2;
  void *pvVar3;
  ulong uVar4;
  mchunkptr pmVar5;
  bool bVar6;
  mchunkptr r;
  mchunkptr p;
  size_t rsize_1;
  char *oldbase;
  msegmentptr sp;
  char *mp;
  size_t rsize;
  size_t req;
  void *mem;
  size_t tsize;
  char *tbase;
  size_t nb_local;
  mstate m_local;
  
  tsize = 0xffffffffffffffff;
  mem = (void *)0x0;
  if ((nb < 0x20000) || (m_local = (mstate)direct_alloc(m,nb), m_local == (mstate)0x0)) {
    pvVar2 = (void *)(nb + 0x20040 & 0xfffffffffffe0000);
    if ((nb < pvVar2) &&
       (pvVar3 = mmap_probe(m->prng,(size_t)pvVar2), pvVar3 != (void *)0xffffffffffffffff)) {
      mem = pvVar2;
      tsize = (size_t)pvVar3;
    }
    if (tsize != 0xffffffffffffffff) {
      oldbase = (char *)&m->seg;
      while( true ) {
        bVar6 = false;
        if (oldbase != (char *)0x0) {
          bVar6 = tsize != *(long *)oldbase + *(long *)(oldbase + 8);
        }
        if (!bVar6) break;
        oldbase = *(char **)(oldbase + 0x10);
      }
      if (((oldbase == (char *)0x0) || (m->top < *(mchunkptr *)oldbase)) ||
         ((mchunkptr)(*(long *)oldbase + *(long *)(oldbase + 8)) <= m->top)) {
        oldbase = (char *)&m->seg;
        while( true ) {
          bVar6 = false;
          if (oldbase != (char *)0x0) {
            bVar6 = *(long *)oldbase != tsize + (long)mem;
          }
          if (!bVar6) break;
          oldbase = *(char **)(oldbase + 0x10);
        }
        if (oldbase != (char *)0x0) {
          oldbase_00 = *(char **)oldbase;
          *(size_t *)oldbase = tsize;
          *(long *)(oldbase + 8) = (long)mem + *(long *)(oldbase + 8);
          pvVar2 = prepend_alloc(m,(char *)tsize,oldbase_00,nb);
          return pvVar2;
        }
        add_segment(m,(char *)tsize,(size_t)mem);
      }
      else {
        *(long *)(oldbase + 8) = (long)mem + *(long *)(oldbase + 8);
        init_top(m,m->top,m->topsize + (long)mem);
      }
      if (nb < m->topsize) {
        uVar4 = m->topsize - nb;
        m->topsize = uVar4;
        pmVar1 = m->top;
        pmVar5 = (mchunkptr)((long)&pmVar1->prev_foot + nb);
        m->top = pmVar5;
        pmVar5->head = uVar4 | 1;
        pmVar1->head = nb | 3;
        return &pmVar1->fd;
      }
    }
    m_local = (mstate)0x0;
  }
  return m_local;
}

Assistant:

static void *alloc_sys(mstate m, size_t nb)
{
  char *tbase = CMFAIL;
  size_t tsize = 0;

  /* Directly map large chunks */
  if (LJ_UNLIKELY(nb >= DEFAULT_MMAP_THRESHOLD)) {
    void *mem = direct_alloc(m, nb);
    if (mem != 0)
      return mem;
  }

  {
    size_t req = nb + TOP_FOOT_SIZE + SIZE_T_ONE;
    size_t rsize = granularity_align(req);
    if (LJ_LIKELY(rsize > nb)) { /* Fail if wraps around zero */
      char *mp = (char *)(CALL_MMAP(m->prng, rsize));
      if (mp != CMFAIL) {
	tbase = mp;
	tsize = rsize;
      }
    }
  }

  if (tbase != CMFAIL) {
    msegmentptr sp = &m->seg;
    /* Try to merge with an existing segment */
    while (sp != 0 && tbase != sp->base + sp->size)
      sp = sp->next;
    if (sp != 0 && segment_holds(sp, m->top)) { /* append */
      sp->size += tsize;
      init_top(m, m->top, m->topsize + tsize);
    } else {
      sp = &m->seg;
      while (sp != 0 && sp->base != tbase + tsize)
	sp = sp->next;
      if (sp != 0) {
	char *oldbase = sp->base;
	sp->base = tbase;
	sp->size += tsize;
	return prepend_alloc(m, tbase, oldbase, nb);
      } else {
	add_segment(m, tbase, tsize);
      }
    }

    if (nb < m->topsize) { /* Allocate from new or extended top space */
      size_t rsize = m->topsize -= nb;
      mchunkptr p = m->top;
      mchunkptr r = m->top = chunk_plus_offset(p, nb);
      r->head = rsize | PINUSE_BIT;
      set_size_and_pinuse_of_inuse_chunk(m, p, nb);
      return chunk2mem(p);
    }
  }

  return NULL;
}